

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subcommand.c
# Opt level: O2

REF_STATUS remove_initial_field_adjoint(REF_NODE ref_node,REF_INT *ldim,REF_DBL **initial_field)

{
  int iVar1;
  REF_DBL *__ptr;
  REF_STATUS RVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  
  iVar1 = *ldim;
  if (((long)iVar1 & 1U) == 0) {
    uVar6 = iVar1 >> 1;
    *ldim = uVar6;
    uVar4 = 0;
    uVar5 = 0;
    if (0 < (int)uVar6) {
      uVar5 = (ulong)uVar6;
    }
    uVar3 = (ulong)(uint)ref_node->max;
    if (ref_node->max < 1) {
      uVar3 = uVar4;
    }
    lVar7 = 0;
    for (uVar8 = 0; uVar8 != uVar3; uVar8 = uVar8 + 1) {
      if ((uVar8 != 0) &&
         (uVar9 = uVar5, uVar10 = uVar4, lVar11 = lVar7, -1 < ref_node->global[uVar8])) {
        while (uVar9 != 0) {
          *(undefined8 *)((long)*initial_field + lVar11) =
               *(undefined8 *)((long)*initial_field + uVar10);
          uVar9 = uVar9 - 1;
          uVar10 = uVar10 + 8;
          lVar11 = lVar11 + 8;
        }
      }
      lVar7 = lVar7 + (long)(int)uVar6 * 8;
      uVar4 = uVar4 + (long)iVar1 * 8;
    }
    fflush(_stdout);
    uVar6 = ref_node->max * *ldim;
    __ptr = *initial_field;
    if (0 < (int)uVar6) {
      __ptr = (REF_DBL *)realloc(__ptr,(ulong)uVar6 << 3);
      *initial_field = __ptr;
    }
    RVar2 = 0;
    if (__ptr == (REF_DBL *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
             0xba2,"remove_initial_field_adjoint","realloc *initial_field NULL");
      uVar4 = (long)ref_node->max * (long)*ldim;
      printf("failed to realloc n int %d uLong %lu size_of %lu = %lu\n",uVar4 & 0xffffffff,uVar4,8,
             uVar4 * 8);
      RVar2 = 2;
    }
  }
  else {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
           0xb98,"remove_initial_field_adjoint","volume field should have a even leading dimension")
    ;
    RVar2 = 1;
  }
  return RVar2;
}

Assistant:

static REF_STATUS remove_initial_field_adjoint(REF_NODE ref_node, REF_INT *ldim,
                                               REF_DBL **initial_field) {
  REF_INT i, node;
  RAS((*ldim) % 2 == 0, "volume field should have a even leading dimension");
  (*ldim) /= 2;
  each_ref_node_valid_node(ref_node, node) {
    if (0 != node) {
      for (i = 0; i < (*ldim); i++) {
        (*initial_field)[i + (*ldim) * node] =
            (*initial_field)[i + 2 * (*ldim) * node];
      }
    }
  }
  ref_realloc(*initial_field, (*ldim) * ref_node_max(ref_node), REF_DBL);
  return REF_SUCCESS;
}